

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const*,unsigned_int&,char_const(&)[3],unsigned_int&>
          (String *__return_storage_ptr__,kj *this,char **params,uint *params_1,char (*params_2) [3]
          ,uint *params_3)

{
  char *__s;
  CappedArray<char,_14UL> local_80;
  undefined1 local_68 [24];
  size_t local_50;
  CappedArray<char,_14UL> local_48;
  
  __s = *(char **)this;
  local_50 = strlen(__s);
  local_68._16_8_ = __s;
  _::Stringifier::operator*(&local_80,(Stringifier *)&_::STR,*(uint *)params);
  local_68._8_8_ = strlen((char *)params_1);
  local_68._0_8_ = params_1;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(uint *)params_2);
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)(local_68 + 0x10),(ArrayPtr<const_char> *)&local_80,
             (CappedArray<char,_14UL> *)local_68,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}